

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# krun.c
# Opt level: O0

void frame_ended(void *user_ctx,int frame_idx,_Bool completed,katherine_frame_info_t *info)

{
  char *pcVar1;
  double recv_perc;
  katherine_frame_info_t *info_local;
  _Bool completed_local;
  int frame_idx_local;
  void *user_ctx_local;
  
  printf("\n");
  printf("Ended frame %d.\n",(ulong)(uint)frame_idx);
  printf(" - tpx3->katherine lost %lu pixels\n",info->lost_pixels);
  printf(" - katherine->pc sent %lu pixels\n",info->sent_pixels);
  printf(" - katherine->pc received %lu pixels\n",info->received_pixels);
  pcVar1 = "not completed";
  if (completed) {
    pcVar1 = "completed";
  }
  printf(" - state: %s\n",pcVar1);
  printf(" - start time: %lu\n",(info->start_time).d);
  printf(" - end time: %lu\n",(info->end_time).d);
  return;
}

Assistant:

void
frame_ended(void *user_ctx, int frame_idx, bool completed, const katherine_frame_info_t *info)
{
    const double recv_perc = 100. * info->received_pixels / info->sent_pixels;

    printf("\n");
    printf("Ended frame %d.\n", frame_idx);
    printf(" - tpx3->katherine lost %lu pixels\n", info->lost_pixels);
    printf(" - katherine->pc sent %lu pixels\n", info->sent_pixels);
    printf(" - katherine->pc received %lu pixels\n", info->received_pixels);
    printf(" - state: %s\n", (completed ? "completed" : "not completed"));
    printf(" - start time: %lu\n", info->start_time.d);
    printf(" - end time: %lu\n", info->end_time.d);
}